

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

void divide_subset_split(size_t *ix_arr,int *x,size_t st,size_t end,char *split_categ,
                        MissingAction missing_action,size_t *st_NA,size_t *end_NA,size_t *split_ix)

{
  size_t sVar1;
  size_t row_2;
  size_t row_1;
  size_t row;
  size_t temp;
  MissingAction missing_action_local;
  char *split_categ_local;
  size_t end_local;
  size_t st_local;
  int *x_local;
  size_t *ix_arr_local;
  
  row_1 = st;
  row = st;
  st_local = st;
  if (missing_action == Fail) {
    for (; row <= end; row = row + 1) {
      if (split_categ[x[ix_arr[row]]] == '\x01') {
        sVar1 = ix_arr[st_local];
        ix_arr[st_local] = ix_arr[row];
        ix_arr[row] = sVar1;
        st_local = st_local + 1;
      }
    }
    *split_ix = st_local;
  }
  else {
    for (; row_1 <= end; row_1 = row_1 + 1) {
      if ((-1 < x[ix_arr[row_1]]) && (split_categ[x[ix_arr[row_1]]] == '\x01')) {
        sVar1 = ix_arr[st_local];
        ix_arr[st_local] = ix_arr[row_1];
        ix_arr[row_1] = sVar1;
        st_local = st_local + 1;
      }
    }
    *st_NA = st_local;
    for (row_2 = st_local; row_2 <= end; row_2 = row_2 + 1) {
      if (x[ix_arr[row_2]] < 0) {
        sVar1 = ix_arr[st_local];
        ix_arr[st_local] = ix_arr[row_2];
        ix_arr[row_2] = sVar1;
        st_local = st_local + 1;
      }
    }
    *end_NA = st_local;
  }
  return;
}

Assistant:

void divide_subset_split(size_t *restrict ix_arr, int x[], size_t st, size_t end, signed char split_categ[],
                         MissingAction missing_action, size_t &restrict st_NA, size_t &restrict end_NA, size_t &restrict split_ix) noexcept
{
    size_t temp;

    /* if NAs are not to be bothered with, just need to do a single pass */
    if (missing_action == Fail)
    {
        /* move to the left if it's l.e. than the split point */
        for (size_t row = st; row <= end; row++)
        {
            if (split_categ[ x[ix_arr[row]] ] == 1)
            {
                temp        = ix_arr[st];
                ix_arr[st]  = ix_arr[row];
                ix_arr[row] = temp;
                st++;
            }
        }
        split_ix = st;
    }

    /* otherwise, first put to the left all l.e. and not NA, then all NAs to the end of the left */
    else
    {
        for (size_t row = st; row <= end; row++)
        {
            if (x[ix_arr[row]] >= 0 && split_categ[ x[ix_arr[row]] ] == 1)
            {
                temp        = ix_arr[st];
                ix_arr[st]  = ix_arr[row];
                ix_arr[row] = temp;
                st++;
            }
        }
        st_NA = st;

        for (size_t row = st; row <= end; row++)
        {
            if (x[ix_arr[row]] < 0)
            {
                temp        = ix_arr[st];
                ix_arr[st]  = ix_arr[row];
                ix_arr[row] = temp;
                st++;
            }
        }
        end_NA = st;
    }
}